

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_config(lyout *out,uint16_t flags,int *first)

{
  char *pcVar1;
  char *val;
  
  if ((flags & 3) != 0) {
    pcVar1 = (char *)0x0;
    if ((flags & 1) != 0) {
      pcVar1 = "true";
    }
    val = "false";
    if ((flags & 2) == 0) {
      val = pcVar1;
    }
    jsons_print_object(out,"config","value",val,1,first);
    return;
  }
  return;
}

Assistant:

static void
jsons_print_config(struct lyout *out, uint16_t flags, int *first)
{
    const char *str = NULL;

    if (flags & LYS_CONFIG_MASK) {
        if (flags & LYS_CONFIG_R) {
            str = "false";
        } else if (flags & LYS_CONFIG_W) {
            str = "true";
        }
        jsons_print_object(out, "config", "value", str, 1, first);
    }
}